

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
double_writer::operator()(double_writer *this,counting_iterator<char> *it)

{
  __copy_move<false,false,std::random_access_iterator_tag> *this_00;
  undefined8 in_R8;
  counting_iterator<char> cVar1;
  
  if (this[8] != (double_writer)0x0) {
    it->count_ = it->count_ + 1;
    *(long *)this = *(long *)this + -1;
  }
  this_00 = *(__copy_move<false,false,std::random_access_iterator_tag> **)
             (*(long *)(this + 0x10) + 8);
  cVar1.count_ = (ulong)*(uint *)&it->blackhole_;
  cVar1._8_8_ = in_R8;
  cVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,fmt::v5::internal::counting_iterator<char>>
                    (this_00,(char *)(this_00 + *(long *)(*(long *)(this + 0x10) + 0x10)),
                     (char *)it->count_,cVar1);
  it->count_ = cVar1.count_;
  it->blackhole_ = cVar1.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) {
      if (sign) {
        *it++ = static_cast<char_type>(sign);
        --n;
      }
      it = internal::copy_str<char_type>(buffer.begin(), buffer.end(), it);
    }